

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountCase::genVertexAttribData
          (OutputCountCase *this)

{
  reference pvVar1;
  float fVar2;
  Vector<float,_4> local_34;
  Vector<float,_4> local_24;
  int local_14;
  OutputCountCase *pOStack_10;
  int ndx;
  OutputCountCase *this_local;
  
  pOStack_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,(long)this->m_primitiveCount);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,(long)this->m_primitiveCount);
  for (local_14 = 0; local_14 < this->m_primitiveCount; local_14 = local_14 + 1) {
    fVar2 = (float)local_14 / (float)this->m_primitiveCount;
    tcu::Vector<float,_4>::Vector(&local_24,-1.0,fVar2 + fVar2 + -1.0,0.0,1.0);
    pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&(this->super_GeometryShaderRenderTest).m_vertexPosData,(long)local_14);
    *(undefined8 *)pvVar1->m_data = local_24.m_data._0_8_;
    *(undefined8 *)(pvVar1->m_data + 2) = local_24.m_data._8_8_;
    if (local_14 % 2 == 0) {
      tcu::Vector<float,_4>::Vector(&local_34,1.0,1.0,1.0,1.0);
    }
    else {
      tcu::Vector<float,_4>::Vector(&local_34,1.0,0.0,0.0,1.0);
    }
    pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,(long)local_14);
    *(undefined8 *)pvVar1->m_data = local_34.m_data._0_8_;
    *(undefined8 *)(pvVar1->m_data + 2) = local_34.m_data._8_8_;
  }
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = this->m_primitiveCount;
  return;
}

Assistant:

void OutputCountCase::genVertexAttribData (void)
{
	m_vertexPosData.resize(m_primitiveCount);
	m_vertexAttrData.resize(m_primitiveCount);

	for (int ndx = 0; ndx < m_primitiveCount; ++ndx)
	{
		m_vertexPosData[ndx] = tcu::Vec4(-1.0f, ((float)ndx) / (float)m_primitiveCount * 2.0f - 1.0f, 0.0f, 1.0f);
		m_vertexAttrData[ndx] = (ndx % 2 == 0) ? tcu::Vec4(1, 1, 1, 1) : tcu::Vec4(1, 0, 0, 1);
	}

	m_numDrawVertices = m_primitiveCount;
}